

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpScanState<float>::Skip
          (ChimpScanState<float> *this,ColumnSegment *segment,idx_t skip_count)

{
  idx_t b;
  ChimpScanState<float> *this_00;
  unsigned_long in_RDX;
  ChimpScanState<float> *in_RDI;
  unsigned_long skip_size;
  INTERNAL_TYPE buffer [1024];
  unsigned_long a;
  undefined8 local_18;
  
  for (local_18 = in_RDX; local_18 != 0; local_18 = local_18 - (long)this_00) {
    a = local_18;
    b = LeftInGroup(in_RDI);
    this_00 = (ChimpScanState<float> *)MinValue<unsigned_long>(a,b);
    ScanGroup<unsigned_int>(this_00,(uint *)in_RDI,a);
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		using INTERNAL_TYPE = typename ChimpType<T>::TYPE;
		INTERNAL_TYPE buffer[ChimpPrimitives::CHIMP_SEQUENCE_SIZE];

		while (skip_count) {
			auto skip_size = MinValue(skip_count, LeftInGroup());
			ScanGroup<CHIMP_TYPE>(buffer, skip_size);
			skip_count -= skip_size;
		}
	}